

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O3

void jpeg_finish_compress(j_compress_ptr cinfo)

{
  int iVar1;
  jpeg_progress_mgr *pjVar2;
  boolean bVar3;
  jpeg_error_mgr *pjVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = cinfo->global_state;
  if (iVar1 - 0x65U < 2) {
    if (cinfo->next_scanline < cinfo->image_height) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x43;
      (*pjVar4->error_exit)((j_common_ptr)cinfo);
    }
    pjVar4 = (jpeg_error_mgr *)&cinfo->master->finish_pass;
  }
  else {
    if (iVar1 == 0x67) goto LAB_0010b54b;
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x14;
    (pjVar4->msg_parm).i[0] = iVar1;
    pjVar4 = cinfo->err;
  }
  (*pjVar4->error_exit)(cinfo);
LAB_0010b54b:
  while (cinfo->master->is_last_pass == 0) {
    (*cinfo->master->prepare_for_pass)(cinfo);
    uVar5 = (ulong)cinfo->total_iMCU_rows;
    if (cinfo->total_iMCU_rows != 0) {
      uVar6 = 0;
      do {
        pjVar2 = cinfo->progress;
        if (pjVar2 != (jpeg_progress_mgr *)0x0) {
          pjVar2->pass_counter = uVar6;
          pjVar2->pass_limit = uVar5;
          (*pjVar2->progress_monitor)((j_common_ptr)cinfo);
        }
        bVar3 = (*cinfo->coef->compress_data)(cinfo,(JSAMPIMAGE)0x0);
        if (bVar3 == 0) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x18;
          (*pjVar4->error_exit)((j_common_ptr)cinfo);
        }
        uVar6 = uVar6 + 1;
        uVar5 = (ulong)cinfo->total_iMCU_rows;
      } while (uVar6 < uVar5);
    }
    (*cinfo->master->finish_pass)(cinfo);
  }
  (*cinfo->marker->write_file_trailer)(cinfo);
  (*cinfo->dest->term_destination)(cinfo);
  jpeg_abort((j_common_ptr)cinfo);
  return;
}

Assistant:

GLOBAL(void)
jpeg_finish_compress(j_compress_ptr cinfo)
{
  JDIMENSION iMCU_row;

  if (cinfo->global_state == CSTATE_SCANNING ||
      cinfo->global_state == CSTATE_RAW_OK) {
    /* Terminate first pass */
    if (cinfo->next_scanline < cinfo->image_height)
      ERREXIT(cinfo, JERR_TOO_LITTLE_DATA);
    (*cinfo->master->finish_pass) (cinfo);
  } else if (cinfo->global_state != CSTATE_WRCOEFS)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Perform any remaining passes */
  while (!cinfo->master->is_last_pass) {
    (*cinfo->master->prepare_for_pass) (cinfo);
    for (iMCU_row = 0; iMCU_row < cinfo->total_iMCU_rows; iMCU_row++) {
      if (cinfo->progress != NULL) {
        cinfo->progress->pass_counter = (long)iMCU_row;
        cinfo->progress->pass_limit = (long)cinfo->total_iMCU_rows;
        (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
      }
      /* We bypass the main controller and invoke coef controller directly;
       * all work is being done from the coefficient buffer.
       */
      if (!(*cinfo->coef->compress_data) (cinfo, (JSAMPIMAGE)NULL))
        ERREXIT(cinfo, JERR_CANT_SUSPEND);
    }
    (*cinfo->master->finish_pass) (cinfo);
  }
  /* Write EOI, do final cleanup */
  (*cinfo->marker->write_file_trailer) (cinfo);
  (*cinfo->dest->term_destination) (cinfo);
  /* We can use jpeg_abort to release memory and reset global_state */
  jpeg_abort((j_common_ptr)cinfo);
}